

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

void spvtools::val::UpdateContinueConstructExitBlocks
               (Function *function,
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *back_edges)

{
  bool bVar1;
  ConstructType CVar2;
  list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *this;
  reference __in;
  reference pCVar3;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *this_00;
  reference ppCVar4;
  pair<spvtools::val::BasicBlock_*,_bool> pVar5;
  tuple<spvtools::val::BasicBlock*&,std::_Swallow_assign_const&> local_e8 [16];
  BasicBlock *local_d8;
  undefined1 local_d0;
  pair<spvtools::val::BasicBlock_*,_bool> local_c8;
  BasicBlock *local_b8;
  BasicBlock *back_edge_block;
  Construct *continue_construct;
  Construct construct;
  iterator __end3;
  iterator __begin3;
  list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *__range3;
  tuple<unsigned_int&,unsigned_int&> local_58 [4];
  anon_class_4_1_5bbb86e2 is_this_header;
  uint32_t local_44;
  uint32_t loop_header_block_id;
  uint32_t back_edge_block_id;
  pair<unsigned_int,_unsigned_int> *edge;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range2;
  list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *constructs;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *back_edges_local;
  Function *function_local;
  
  this = Function::constructs_abi_cxx11_(function);
  __end2 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin(back_edges);
  edge = (pair<unsigned_int,_unsigned_int> *)
         std::
         vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ::end(back_edges);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)&edge);
    if (!bVar1) {
      return;
    }
    __in = __gnu_cxx::
           __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
           ::operator*(&__end2);
    _loop_header_block_id = __in;
    std::tie<unsigned_int,unsigned_int>((uint *)local_58,&local_44);
    std::tuple<unsigned_int&,unsigned_int&>::operator=(local_58,__in);
    __end3 = std::__cxx11::list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>
             ::begin(this);
    construct.exit_block_ =
         (BasicBlock *)
         std::__cxx11::list<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>::
         end(this);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&construct.exit_block_), bVar1) {
      pCVar3 = std::_List_iterator<spvtools::val::Construct>::operator*(&__end3);
      Construct::Construct((Construct *)&continue_construct,pCVar3);
      bVar1 = UpdateContinueConstructExitBlocks::anon_class_4_1_5bbb86e2::operator()
                        ((anon_class_4_1_5bbb86e2 *)((long)&__range3 + 4),
                         (Construct *)&continue_construct);
      if (bVar1) {
        this_00 = Construct::corresponding_constructs((Construct *)&continue_construct);
        ppCVar4 = std::
                  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
                  back(this_00);
        back_edge_block = (BasicBlock *)*ppCVar4;
        CVar2 = Construct::type((Construct *)back_edge_block);
        if (CVar2 != kContinue) {
          __assert_fail("continue_construct->type() == ConstructType::kContinue",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_cfg.cpp"
                        ,0x198,
                        "void spvtools::val::UpdateContinueConstructExitBlocks(Function &, const std::vector<std::pair<uint32_t, uint32_t>> &)"
                       );
        }
        pVar5 = Function::GetBlock(function,local_44);
        local_d8 = pVar5.first;
        local_d0 = pVar5.second;
        local_c8.first = local_d8;
        local_c8.second = (bool)local_d0;
        std::tie<spvtools::val::BasicBlock*,std::_Swallow_assign_const>
                  ((BasicBlock **)local_e8,(_Swallow_assign *)&local_b8);
        std::tuple<spvtools::val::BasicBlock*&,std::_Swallow_assign_const&>::operator=
                  (local_e8,&local_c8);
        Construct::set_exit((Construct *)back_edge_block,local_b8);
      }
      Construct::~Construct((Construct *)&continue_construct);
      std::_List_iterator<spvtools::val::Construct>::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void UpdateContinueConstructExitBlocks(
    Function& function,
    const std::vector<std::pair<uint32_t, uint32_t>>& back_edges) {
  auto& constructs = function.constructs();
  // TODO(umar): Think of a faster way to do this
  for (auto& edge : back_edges) {
    uint32_t back_edge_block_id;
    uint32_t loop_header_block_id;
    std::tie(back_edge_block_id, loop_header_block_id) = edge;
    auto is_this_header = [=](Construct& c) {
      return c.type() == ConstructType::kLoop &&
             c.entry_block()->id() == loop_header_block_id;
    };

    for (auto construct : constructs) {
      if (is_this_header(construct)) {
        Construct* continue_construct =
            construct.corresponding_constructs().back();
        assert(continue_construct->type() == ConstructType::kContinue);

        BasicBlock* back_edge_block;
        std::tie(back_edge_block, std::ignore) =
            function.GetBlock(back_edge_block_id);
        continue_construct->set_exit(back_edge_block);
      }
    }
  }
}